

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O2

vector<duckdb::CreateSecretFunction,_true> *
duckdb::CreateHTTPSecretFunctions::GetDefaultSecretFunctions(void)

{
  named_parameter_type_map_t *pnVar1;
  mapped_type *pmVar2;
  vector<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_> *in_RDI;
  allocator local_1b1;
  key_type local_1b0;
  LogicalType local_190;
  CreateSecretFunction http_env_fun;
  LogicalType local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  LogicalType local_b0;
  CreateSecretFunction http_config_fun;
  
  (in_RDI->
  super__Vector_base<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  http_config_fun.secret_type._M_dataplus._M_p = (pointer)&http_config_fun.secret_type.field_2;
  http_config_fun.secret_type._M_string_length = 0;
  http_config_fun.secret_type.field_2._M_local_buf[0] = '\0';
  http_config_fun.provider._M_dataplus._M_p = (pointer)&http_config_fun.provider.field_2;
  http_config_fun.provider._M_string_length = 0;
  (in_RDI->
  super__Vector_base<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  http_config_fun.provider.field_2._M_local_buf[0] = '\0';
  http_config_fun.named_parameters._M_h._M_buckets =
       &http_config_fun.named_parameters._M_h._M_single_bucket;
  http_config_fun.named_parameters._M_h._M_bucket_count = 1;
  http_config_fun.named_parameters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  http_config_fun.named_parameters._M_h._M_element_count = 0;
  http_config_fun.named_parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  http_config_fun.named_parameters._M_h._M_rehash_policy._M_next_resize = 0;
  http_config_fun.named_parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::__cxx11::string::assign((char *)&http_config_fun);
  ::std::__cxx11::string::assign((char *)&http_config_fun.provider);
  http_config_fun.function = CreateHTTPSecretFromConfig;
  LogicalType::LogicalType((LogicalType *)&local_1b0,VARCHAR);
  ::std::__cxx11::string::string((string *)&http_env_fun,"http_proxy",(allocator *)&local_190);
  pnVar1 = &http_config_fun.named_parameters;
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&http_env_fun.secret_type);
  LogicalType::operator=(pmVar2,(LogicalType *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&http_env_fun);
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  LogicalType::LogicalType((LogicalType *)&local_1b0,VARCHAR);
  ::std::__cxx11::string::string
            ((string *)&http_env_fun,"http_proxy_password",(allocator *)&local_190);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&http_env_fun.secret_type);
  LogicalType::operator=(pmVar2,(LogicalType *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&http_env_fun);
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  LogicalType::LogicalType((LogicalType *)&local_1b0,VARCHAR);
  ::std::__cxx11::string::string
            ((string *)&http_env_fun,"http_proxy_username",(allocator *)&local_190);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&http_env_fun.secret_type);
  LogicalType::operator=(pmVar2,(LogicalType *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&http_env_fun);
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  LogicalType::LogicalType(&local_b0,VARCHAR);
  LogicalType::LogicalType(&local_c8,VARCHAR);
  LogicalType::MAP((LogicalType *)&local_1b0,&local_b0,&local_c8);
  ::std::__cxx11::string::string
            ((string *)&http_env_fun,"extra_http_headers",(allocator *)&local_190);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&http_env_fun.secret_type);
  LogicalType::operator=(pmVar2,(LogicalType *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&http_env_fun);
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  LogicalType::~LogicalType(&local_c8);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::LogicalType((LogicalType *)&local_1b0,VARCHAR);
  ::std::__cxx11::string::string((string *)&http_env_fun,"bearer_token",(allocator *)&local_190);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&http_env_fun.secret_type);
  LogicalType::operator=(pmVar2,(LogicalType *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&http_env_fun);
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  ::std::vector<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_>::
  emplace_back<duckdb::CreateSecretFunction>(in_RDI,&http_config_fun);
  http_env_fun.secret_type._M_dataplus._M_p = (pointer)&http_env_fun.secret_type.field_2;
  http_env_fun.secret_type._M_string_length = 0;
  http_env_fun.secret_type.field_2._M_local_buf[0] = '\0';
  http_env_fun.provider._M_dataplus._M_p = (pointer)&http_env_fun.provider.field_2;
  http_env_fun.provider._M_string_length = 0;
  http_env_fun.provider.field_2._M_local_buf[0] = '\0';
  http_env_fun.named_parameters._M_h._M_buckets =
       &http_env_fun.named_parameters._M_h._M_single_bucket;
  http_env_fun.named_parameters._M_h._M_bucket_count = 1;
  http_env_fun.named_parameters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  http_env_fun.named_parameters._M_h._M_element_count = 0;
  http_env_fun.named_parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  http_env_fun.named_parameters._M_h._M_rehash_policy._M_next_resize = 0;
  http_env_fun.named_parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::__cxx11::string::assign((char *)&http_env_fun);
  ::std::__cxx11::string::assign((char *)&http_env_fun.provider);
  http_env_fun.function = CreateHTTPSecretFromEnv;
  LogicalType::LogicalType(&local_190,VARCHAR);
  ::std::__cxx11::string::string((string *)&local_1b0,"http_proxy",&local_1b1);
  pnVar1 = &http_env_fun.named_parameters;
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&local_1b0);
  LogicalType::operator=(pmVar2,&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  LogicalType::~LogicalType(&local_190);
  LogicalType::LogicalType(&local_190,VARCHAR);
  ::std::__cxx11::string::string((string *)&local_1b0,"http_proxy_password",&local_1b1);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&local_1b0);
  LogicalType::operator=(pmVar2,&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  LogicalType::~LogicalType(&local_190);
  LogicalType::LogicalType(&local_190,VARCHAR);
  ::std::__cxx11::string::string((string *)&local_1b0,"http_proxy_username",&local_1b1);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&local_1b0);
  LogicalType::operator=(pmVar2,&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  LogicalType::~LogicalType(&local_190);
  LogicalType::LogicalType(&local_e0,VARCHAR);
  LogicalType::LogicalType(&local_f8,VARCHAR);
  LogicalType::MAP(&local_190,&local_e0,&local_f8);
  ::std::__cxx11::string::string((string *)&local_1b0,"extra_http_headers",&local_1b1);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&local_1b0);
  LogicalType::operator=(pmVar2,&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  LogicalType::~LogicalType(&local_190);
  LogicalType::~LogicalType(&local_f8);
  LogicalType::~LogicalType(&local_e0);
  LogicalType::LogicalType(&local_190,VARCHAR);
  ::std::__cxx11::string::string((string *)&local_1b0,"bearer_token",&local_1b1);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)pnVar1,&local_1b0);
  LogicalType::operator=(pmVar2,&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  LogicalType::~LogicalType(&local_190);
  ::std::vector<duckdb::CreateSecretFunction,_std::allocator<duckdb::CreateSecretFunction>_>::
  emplace_back<duckdb::CreateSecretFunction>(in_RDI,&http_env_fun);
  CreateSecretFunction::~CreateSecretFunction(&http_env_fun);
  CreateSecretFunction::~CreateSecretFunction(&http_config_fun);
  return (vector<duckdb::CreateSecretFunction,_true> *)in_RDI;
}

Assistant:

vector<CreateSecretFunction> CreateHTTPSecretFunctions::GetDefaultSecretFunctions() {
	vector<CreateSecretFunction> result;

	// HTTP secret CONFIG provider
	CreateSecretFunction http_config_fun;
	http_config_fun.secret_type = "http";
	http_config_fun.provider = "config";
	http_config_fun.function = CreateHTTPSecretFromConfig;

	http_config_fun.named_parameters["http_proxy"] = LogicalType::VARCHAR;
	http_config_fun.named_parameters["http_proxy_password"] = LogicalType::VARCHAR;
	http_config_fun.named_parameters["http_proxy_username"] = LogicalType::VARCHAR;

	http_config_fun.named_parameters["extra_http_headers"] =
	    LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	http_config_fun.named_parameters["bearer_token"] = LogicalType::VARCHAR;
	result.push_back(std::move(http_config_fun));

	// HTTP secret ENV provider
	CreateSecretFunction http_env_fun;
	http_env_fun.secret_type = "http";
	http_env_fun.provider = "env";
	http_env_fun.function = CreateHTTPSecretFromEnv;

	http_env_fun.named_parameters["http_proxy"] = LogicalType::VARCHAR;
	http_env_fun.named_parameters["http_proxy_password"] = LogicalType::VARCHAR;
	http_env_fun.named_parameters["http_proxy_username"] = LogicalType::VARCHAR;

	http_env_fun.named_parameters["extra_http_headers"] = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	http_env_fun.named_parameters["bearer_token"] = LogicalType::VARCHAR;
	result.push_back(std::move(http_env_fun));

	return result;
}